

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_buffer.c
# Opt level: O0

int bufferResetArgs(mpt_iterator *it)

{
  int ret;
  mpt_metaBuffer *m;
  mpt_iterator *it_local;
  
  it_local._4_4_ = bufferReset(it);
  if (0 < it_local._4_4_) {
    it_local._4_4_ = bufferAdvance(it);
  }
  return it_local._4_4_;
}

Assistant:

static int bufferResetArgs(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(metaBuffer) *m = MPT_baseaddr(metaBuffer, it, _it);
	int ret;
	if ((ret = bufferReset(&m->_it)) <= 0) {
		return ret;
	}
	/* consume first argument of iterator */
	return bufferAdvance(&m->_it);
}